

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsignalmapper.cpp
# Opt level: O3

void QSignalMapper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  QObject *sender;
  int iVar3;
  QSignalMapperPrivate *this;
  long in_FS_OFFSET;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == mappedInt && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == mappedString && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == mappedObject && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    goto switchD_002c27c4_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_002c27c4_default;
  switch(_id) {
  case 0:
    local_20 = &local_30;
    local_30 = CONCAT44(local_30._4_4_,*_a[1]);
    iVar3 = 0;
    break;
  case 1:
    local_20 = (undefined8 *)_a[1];
    iVar3 = 1;
    break;
  case 2:
    local_30 = *_a[1];
    local_20 = &local_30;
    iVar3 = 2;
    break;
  case 3:
    sender = QObject::sender(_o);
    this = (QSignalMapperPrivate *)(_o->d_ptr).d;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
LAB_002c28c7:
      QSignalMapperPrivate::emitMappedValues(this,sender);
      return;
    }
    goto LAB_002c290f;
  case 4:
    sender = *_a[1];
    this = (QSignalMapperPrivate *)(_o->d_ptr).d;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) goto LAB_002c28c7;
    goto LAB_002c290f;
  default:
    goto switchD_002c27c4_default;
  }
  local_28 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_28);
switchD_002c27c4_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_002c290f:
  __stack_chk_fail();
}

Assistant:

void QSignalMapper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSignalMapper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->mappedInt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->mappedString((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->mappedObject((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        case 3: _t->map(); break;
        case 4: _t->map((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(int )>(_a, &QSignalMapper::mappedInt, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(const QString & )>(_a, &QSignalMapper::mappedString, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(QObject * )>(_a, &QSignalMapper::mappedObject, 2))
            return;
    }
}